

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

void link_easy(Curl_multi *multi,Curl_easy *data)

{
  Curl_easy *pCVar1;
  
  data->next = (Curl_easy *)0x0;
  if (multi->easyp == (Curl_easy *)0x0) {
    data->prev = (Curl_easy *)0x0;
    multi->easyp = data;
  }
  else {
    pCVar1 = multi->easylp;
    pCVar1->next = data;
    data->prev = pCVar1;
  }
  multi->easylp = data;
  return;
}

Assistant:

static void link_easy(struct Curl_multi *multi,
                      struct Curl_easy *data)
{
  /* We add the new easy entry last in the list. */
  data->next = NULL; /* end of the line */
  if(multi->easyp) {
    struct Curl_easy *last = multi->easylp;
    last->next = data;
    data->prev = last;
    multi->easylp = data; /* the new last node */
  }
  else {
    /* first node, make prev NULL! */
    data->prev = NULL;
    multi->easylp = multi->easyp = data; /* both first and last */
  }
}